

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall rw::FrameList_::streamWrite(FrameList_ *this,Stream *stream)

{
  int iVar1;
  int iVar2;
  Frame *pFVar3;
  int local_6c;
  int32 i_2;
  Frame *f;
  int32 i_1;
  int32 i;
  int structsize;
  int size;
  FrameStreamData buf;
  Stream *stream_local;
  FrameList_ *this_local;
  
  iVar1 = this->numFrames * 0x38;
  i = iVar1 + 0x10;
  buf._48_8_ = stream;
  for (f._4_4_ = 0; f._4_4_ < this->numFrames; f._4_4_ = f._4_4_ + 1) {
    iVar2 = PluginList::streamGetSize((PluginList *)&Frame::s_plglist,this->frames[f._4_4_]);
    i = iVar2 + 0xc + i;
  }
  writeChunkHeader((Stream *)buf._48_8_,0xe,i);
  writeChunkHeader((Stream *)buf._48_8_,1,iVar1 + 4);
  Stream::writeU32((Stream *)buf._48_8_,this->numFrames);
  for (f._0_4_ = 0; (int)f < this->numFrames; f._0_4_ = (int)f + 1) {
    pFVar3 = this->frames[(int)f];
    structsize = (pFVar3->matrix).right.x;
    unique0x00012004 = (pFVar3->matrix).right.y;
    buf.right.x = (pFVar3->matrix).right.z;
    buf.right.y = (pFVar3->matrix).up.x;
    buf.right.z = (pFVar3->matrix).up.y;
    buf.up.x = (pFVar3->matrix).up.z;
    buf.up.y = (pFVar3->matrix).at.x;
    buf.up.z = (pFVar3->matrix).at.y;
    buf.at.x = (pFVar3->matrix).at.z;
    buf.at.y = (pFVar3->matrix).pos.x;
    buf.at.z = (pFVar3->matrix).pos.y;
    buf.pos.x = (pFVar3->matrix).pos.z;
    pFVar3 = Frame::getParent(pFVar3);
    buf.pos.y = (float32)findPointer(pFVar3,this->frames,this->numFrames);
    buf.pos.z = 0.0;
    Stream::write32((Stream *)buf._48_8_,&structsize,0x38);
  }
  for (local_6c = 0; local_6c < this->numFrames; local_6c = local_6c + 1) {
    PluginList::streamWrite
              ((PluginList *)&Frame::s_plglist,(Stream *)buf._48_8_,this->frames[local_6c]);
  }
  return;
}

Assistant:

void
FrameList_::streamWrite(Stream *stream)
{
	FrameStreamData buf;

	int size = 0, structsize = 0;
	structsize = 4 + this->numFrames*sizeof(FrameStreamData);
	size += 12 + structsize;
	for(int32 i = 0; i < this->numFrames; i++)
		size += 12 + Frame::s_plglist.streamGetSize(this->frames[i]);

	writeChunkHeader(stream, ID_FRAMELIST, size);
	writeChunkHeader(stream, ID_STRUCT, structsize);
	stream->writeU32(this->numFrames);
	for(int32 i = 0; i < this->numFrames; i++){
		Frame *f = this->frames[i];
		buf.right = f->matrix.right;
		buf.up = f->matrix.up;
		buf.at = f->matrix.at;
		buf.pos = f->matrix.pos;
		buf.parent = findPointer(f->getParent(), (void**)this->frames,
		                         this->numFrames);
		buf.matflag = 0; //f->matflag;
		stream->write32(&buf, sizeof(buf));
	}
	for(int32 i = 0; i < this->numFrames; i++)
		Frame::s_plglist.streamWrite(stream, this->frames[i]);
}